

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

bool tcu::isCombinedDepthStencilType(ChannelType type)

{
  undefined1 local_d;
  ChannelType type_local;
  
  local_d = true;
  if (((type != UNSIGNED_INT_16_8_8) && (local_d = true, type != UNSIGNED_INT_24_8)) &&
     (local_d = true, type != UNSIGNED_INT_24_8_REV)) {
    local_d = type == FLOAT_UNSIGNED_INT_24_8_REV;
  }
  return local_d;
}

Assistant:

bool isCombinedDepthStencilType (TextureFormat::ChannelType type)
{
	// make sure to update this if type table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	return	type == TextureFormat::UNSIGNED_INT_16_8_8			||
			type == TextureFormat::UNSIGNED_INT_24_8			||
			type == TextureFormat::UNSIGNED_INT_24_8_REV		||
			type == TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV;
}